

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagPrinterFancyUnix.cpp
# Opt level: O1

void __thiscall Mond::DiagPrinterFancy::SetColor(DiagPrinterFancy *this,Severity s)

{
  if (s < (Error|Warning)) {
    printf(&DAT_00126610 + *(int *)(&DAT_00126610 + (ulong)s * 4));
    return;
  }
  return;
}

Assistant:

void DiagPrinterFancy::SetColor(Severity s)
{
	switch (s) {
	case Info:
		printf("\x1B[1;36m");
		break;
	case Warning:
		printf("\x1B[1;33m");
		break;
	case Error:
		printf("\x1B[1;31m");
		break;
	}
}